

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int test_double(int verbose)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  double power_1;
  double dVar3;
  double dVar4;
  double power;
  
  if (verbose != 0) {
    printf("  sizeof(double) = %2u\n",8);
  }
  dVar3 = 1.0;
  do {
    do {
      dVar4 = dVar3;
      dVar3 = dVar4 * 0.5;
    } while (dVar3 + 1.0 != 1.0);
  } while (NAN(dVar3 + 1.0));
  if (verbose != 0) {
    printf("  machine epsilon = %13.5le ");
  }
  dVar3 = 1.0;
  uVar1 = 0x35;
  do {
    dVar3 = dVar3 * 0.5;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  uVar1 = 1;
  if (dVar4 != dVar3 || verbose != 0) {
    uVar1 = -(uint)(dVar4 == dVar3) & 1;
    __s = "[IEEE 754 64-bit macheps]";
    if (dVar4 != dVar3) {
      __s = "[not IEEE 754 conformant] !!";
    }
    if (NAN(dVar4) || NAN(dVar3)) {
      __s = "[not IEEE 754 conformant] !!";
    }
    puts(__s);
  }
  dVar3 = 1.0;
  do {
    do {
      dVar4 = dVar3;
      dVar3 = dVar4 * 0.5;
    } while (dVar3 != 0.0);
  } while (NAN(dVar3));
  dVar3 = 1.0;
  uVar2 = 0x433;
  do {
    dVar3 = dVar3 * 0.5;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
    dVar3 = 1.0;
    uVar2 = 0x3ff;
    do {
      dVar3 = dVar3 * 0.5;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
      puts("[not IEEE 754 conformant] !!");
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

int test_double(int verbose)
{
  double x;
  int pass = 1;

  // (void)printf("double:\n");
  if (verbose) {
    (void)printf("  sizeof(double) = %2u\n", (unsigned int)sizeof(double));
#ifdef CPU86  // <float.h>
    (void)printf("  DBL_MANT_DIG = %2d\n", DBL_MANT_DIG);
#endif
  }

  x = 1.0;
  while (dstore(1.0 + x/2.0) != 1.0)
    x /= 2.0;
  if (verbose) 
    (void)printf("  machine epsilon = %13.5le ", x);

  if (x == (double)fppow2(-52)) {
    if (verbose)
      (void)printf("[IEEE 754 64-bit macheps]\n");
  } else {
    (void)printf("[not IEEE 754 conformant] !!\n");
    pass = 0;
  }

  x = 1.0;
  while (dstore(x / 2.0) != 0.0)
    x /= 2.0;
  //if (verbose)
  //  (void)printf("  smallest positive number = %13.5le ", x);

  if (x == (double)fppow2(-1074)) {
    //if (verbose)
    //  (void)printf("[smallest 64-bit subnormal]\n");
  } else if (x == (double)fppow2(-1022)) {
    //if (verbose)
    //  (void)printf("[smallest 64-bit normal]\n");
  } else {
    (void)printf("[not IEEE 754 conformant] !!\n");
    pass = 0;
  }

  return pass;
}